

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerMain.cpp
# Opt level: O0

void __thiscall
Analysis::LexicalAnalysis::LexicalAnalysis(LexicalAnalysis *this,string_view filename)

{
  const_pointer pvVar1;
  LexicalAnalysis *this_local;
  string_view filename_local;
  
  filename_local._M_len = (size_t)filename._M_str;
  this_local = (LexicalAnalysis *)filename._M_len;
  std::ifstream::ifstream(this);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(&this->Tokens);
  std::vector<int,_std::allocator<int>_>::vector(&this->Types);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  std::ifstream::open(this,pvVar1,8);
  return;
}

Assistant:

LexicalAnalysis::LexicalAnalysis(std::string_view filename) {
        file.open(filename.data());
    }